

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O3

String * __thiscall String::operator+(String *__return_storage_ptr__,String *this,char (*str) [2])

{
  usize *puVar1;
  String *other;
  String local_68;
  String local_40;
  
  String(&local_40,this);
  local_68.data = &local_68._data;
  local_68._data.ref = 0;
  local_68._data.len = 1;
  local_68._data.str = *str;
  other = append(&local_40,&local_68);
  String(__return_storage_ptr__,other);
  if ((local_68.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_68.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_68.data != (Data *)0x0)) {
      operator_delete__(local_68.data);
    }
  }
  if ((local_40.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_40.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_40.data != (Data *)0x0)) {
      operator_delete__(local_40.data);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String operator+(const String& other) const {return String(*this).append(other);}